

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall OpenMD::HBondJumpZ::writeCorrelate(HBondJumpZ *this)

{
  double dVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  reference pvVar7;
  reference this_00;
  undefined8 uVar8;
  TimeCorrFunc<double> *in_RDI;
  uint j;
  uint i;
  Revision r;
  ofstream ofs;
  Revision *in_stack_fffffffffffffd18;
  uint local_260;
  uint local_25c;
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar3,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"HBondJumpZ::writeCorrelate Error: fail to open %s\n",uVar8);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = std::operator<<(local_208,"# ");
    psVar5 = TimeCorrFunc<double>::getCorrFuncType_abi_cxx11_(in_RDI);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)poVar4);
    poVar4 = std::operator<<(poVar4,local_238);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_238);
    poVar4 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffd18);
    poVar4 = std::operator<<(poVar4,local_258);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_258);
    poVar4 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar4,(string *)&in_RDI->selectionScript1_);
    poVar4 = std::operator<<(local_208,"\"\tselection script2: \"");
    poVar4 = std::operator<<(poVar4,(string *)&in_RDI->selectionScript2_);
    std::operator<<(poVar4,"\"\n");
    poVar4 = std::operator<<(local_208,"# privilegedAxis computed as ");
    poVar4 = std::operator<<(poVar4,(string *)&in_RDI[1].evaluator1_.compiler.errorLine);
    std::operator<<(poVar4," axis \n");
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      poVar4 = std::operator<<(local_208,"# parameters: ");
      poVar4 = std::operator<<(poVar4,(string *)&in_RDI->paramString_);
      std::operator<<(poVar4,"\n");
    }
    std::operator<<(local_208,"#time\tcorrVal\n");
    for (local_25c = 0; local_25c < in_RDI->nTimeBins_; local_25c = local_25c + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->times_,(ulong)local_25c);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->times_,0);
      std::ostream::operator<<(local_208,dVar1 - *pvVar7);
      for (local_260 = 0;
          local_260 < *(uint *)((long)&in_RDI[1].evaluator1_.compiler.errorMessage.field_2 + 8);
          local_260 = local_260 + 1) {
        poVar4 = std::operator<<(local_208,"\t");
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&in_RDI[1].evaluator1_.compiler.lineIndices.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,(ulong)local_25c);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_260);
        std::ostream::operator<<(poVar4,*pvVar7);
      }
      std::operator<<(local_208,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void HBondJumpZ::writeCorrelate() {
    ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getCorrFuncType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";
      ofs << "#time\tcorrVal\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs << "\t" << histogram_[i][j];
        }
        ofs << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondJumpZ::writeCorrelate Error: fail to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }